

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O0

char * FIX::integer_to_string<int>(char *buf,size_t len,int t)

{
  uint uVar1;
  uint local_2c;
  unsigned_int pos;
  type number;
  char *p;
  bool isNegative;
  int t_local;
  size_t len_local;
  char *buf_local;
  
  local_2c = _UNSIGNED_VALUE_OF<int>(t);
  _pos = buf + len;
  while (99 < local_2c) {
    uVar1 = local_2c % 100;
    local_2c = local_2c / 100;
    _pos[-1] = digit_pairs[uVar1 * 2 + 1];
    _pos[-2] = digit_pairs[uVar1 << 1];
    _pos = _pos + -2;
  }
  if (local_2c < 10) {
    _pos[-1] = (char)local_2c + '0';
    _pos = _pos + -1;
  }
  else {
    _pos[-1] = digit_pairs[local_2c * 2 + 1];
    _pos[-2] = digit_pairs[local_2c << 1];
    _pos = _pos + -2;
  }
  if (t < 0) {
    _pos[-1] = '-';
    _pos = _pos + -1;
  }
  return _pos;
}

Assistant:

inline char *integer_to_string(char *buf, const size_t len, const T t) {
  const bool isNegative = t < 0;
  char *p = buf + len;

  typename std::make_unsigned<T>::type number = UNSIGNED_VALUE_OF(t);

  while (number > 99) {
    unsigned_int pos = number % 100;
    number /= 100;

    *--p = digit_pairs[2 * pos + 1];
    *--p = digit_pairs[2 * pos];
  }

  if (number > 9) {
    *--p = digit_pairs[2 * number + 1];
    *--p = digit_pairs[2 * number];
  } else {
    *--p = '0' + char(number);
  }

  if (isNegative) {
    *--p = '-';
  }

  return p;
}